

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int fstat_req(chmgr *chmgr,char *lname,char *rname)

{
  byte bVar1;
  size_t sVar2;
  ftmgr *pfVar3;
  undefined1 *payload;
  uint8_t *__ptr;
  uint32_t __v;
  uint8_t *fs;
  uint32_t local_28;
  int iStack_24;
  uint8_t nalen;
  uint32_t mode;
  int ret;
  char *rname_local;
  char *lname_local;
  chmgr *chmgr_local;
  
  iStack_24 = -1;
  _mode = rname;
  rname_local = lname;
  lname_local = (char *)chmgr;
  sVar2 = strlen(rname);
  bVar1 = (char)sVar2 + 1;
  pfVar3 = alloc_ftmgr(rname_local,(chmgr *)lname_local,&local_28);
  *(ftmgr **)(lname_local + 0x18) = pfVar3;
  if (*(long *)(lname_local + 0x18) != 0) {
    payload = (undefined1 *)malloc((long)(int)(bVar1 + 4));
    *payload = (char)local_28;
    payload[1] = (char)(local_28 >> 8);
    payload[2] = (char)(local_28 >> 0x10);
    payload[3] = (char)(local_28 >> 0x18);
    strcpy(payload + 4,_mode);
    iStack_24 = fm_write((chmgr *)lname_local,0x80,payload,bVar1 + 4);
    free(payload);
  }
  return iStack_24;
}

Assistant:

static int fstat_req(struct chmgr *chmgr, const char *lname, const char *rname)
{
    int ret = -1;
    uint32_t mode;
    const uint8_t nalen = strlen(rname) + 1;
    uint8_t *fs = NULL;
    chmgr->ftmgr = alloc_ftmgr(lname, chmgr, &mode);
    if(chmgr->ftmgr == NULL)
        goto __exit;

    fs = (uint8_t *)malloc(FSTAT_HDR_SIZE + nalen);
    U32_TO_STREAM(fs, mode);
    strcpy((char*)(fs + FSTAT_HDR_SIZE), rname);
    ret = fm_write(chmgr, CTRL_FSTAT_REQ, fs, FSTAT_HDR_SIZE + nalen);
    free(fs);

__exit:
    return ret;
}